

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void basic_suite::fail_past_end(void)

{
  char input [1];
  decoder_type decoder;
  value_type local_149;
  undefined4 local_148;
  value local_144;
  basic_decoder<char> local_140;
  
  local_140.input.head = &local_149;
  local_149 = '\0';
  local_140.input.tail = local_140.input.head;
  memset(&local_140.current,0,0x120);
  local_140.current.code = uninitialized;
  local_140.current.view.head = (const_pointer)0x0;
  local_140.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_140);
  local_144 = local_140.current.code;
  local_148 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x163,"void basic_suite::fail_past_end()",&local_144,&local_148);
  if (error_unexpected_token < local_140.current.code) {
    if (local_140.current.code == end) {
      local_140.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_140);
    }
  }
  local_144 = local_140.current.code;
  local_148 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x165,"void basic_suite::fail_past_end()",&local_144,&local_148);
  return;
}

Assistant:

void fail_past_end()
{
    const char input[] = "";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
}